

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  double *pdVar1;
  float fVar2;
  float fVar3;
  ImVec2 IVar4;
  double dVar5;
  short sVar6;
  ImGuiWindow *pIVar7;
  ImGuiContext *pIVar8;
  ImGuiWindow *pIVar9;
  undefined1 uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ImGuiWindow *pIVar14;
  byte bVar15;
  ImGuiContext *g;
  byte bVar16;
  int iVar17;
  ImGuiWindow *pIVar18;
  bool bVar19;
  byte bVar20;
  byte bVar21;
  ImGuiWindow *pIVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  
  pIVar8 = GImGui;
  IVar4 = (GImGui->Style).TouchExtraPadding;
  auVar24._8_8_ = 0;
  auVar24._0_4_ = IVar4.x;
  auVar24._4_4_ = IVar4.y;
  auVar24 = maxps(auVar24,_DAT_00199360);
  GImGui->WindowsHoverPadding = auVar24._0_8_;
  pIVar9 = pIVar8->MovingWindow;
  pIVar22 = (ImGuiWindow *)0x0;
  if ((pIVar9 != (ImGuiWindow *)0x0) && ((pIVar9->Flags & 0x200) == 0)) {
    pIVar22 = pIVar9;
  }
  lVar12 = (long)(pIVar8->Windows).Size;
  if (lVar12 < 1) {
    pIVar14 = (ImGuiWindow *)0x0;
  }
  else {
    bVar23 = (pIVar8->IO).ConfigWindowsResizeFromEdges;
    uVar13 = lVar12 + 1;
    pIVar14 = (ImGuiWindow *)0x0;
    do {
      pIVar7 = (pIVar8->Windows).Data[uVar13 - 2];
      if (((pIVar7->Active == true) && (pIVar7->Hidden == false)) &&
         (uVar11 = pIVar7->Flags, (uVar11 >> 9 & 1) == 0)) {
        fVar25 = auVar24._0_4_;
        if ((bVar23 & 1U) == 0) {
          fVar25 = IVar4.x;
        }
        if ((uVar11 & 0x1000042) != 0) {
          fVar25 = IVar4.x;
        }
        fVar2 = (pIVar8->IO).MousePos.x;
        if ((pIVar7->OuterRectClipped).Min.x - fVar25 <= fVar2) {
          fVar26 = auVar24._4_4_;
          if ((bVar23 & 1U) == 0) {
            fVar26 = IVar4.y;
          }
          if ((uVar11 & 0x1000042) != 0) {
            fVar26 = IVar4.y;
          }
          fVar3 = (pIVar8->IO).MousePos.y;
          if (((((pIVar7->OuterRectClipped).Min.y - fVar26 <= fVar3) &&
               (fVar2 < fVar25 + (pIVar7->OuterRectClipped).Max.x)) &&
              (fVar3 < fVar26 + (pIVar7->OuterRectClipped).Max.y)) &&
             (((sVar6 = (pIVar7->HitTestHoleSize).x, sVar6 == 0 ||
               (fVar25 = (float)(int)(pIVar7->HitTestHoleOffset).x + (pIVar7->Pos).x, fVar2 < fVar25
               )) || ((fVar25 + (float)(int)sVar6 <= fVar2 ||
                      ((fVar25 = (float)(int)(pIVar7->HitTestHoleOffset).y + (pIVar7->Pos).y,
                       fVar3 < fVar25 || (fVar25 + (float)(int)(pIVar7->HitTestHoleSize).y <= fVar3)
                       ))))))) {
            if (pIVar22 == (ImGuiWindow *)0x0) {
              pIVar22 = pIVar7;
            }
            pIVar18 = pIVar7;
            if (pIVar14 != (ImGuiWindow *)0x0) {
              pIVar18 = pIVar14;
            }
            if (((pIVar9 == (ImGuiWindow *)0x0) || (pIVar14 != (ImGuiWindow *)0x0)) ||
               (pIVar18 = pIVar7, pIVar7->RootWindow != pIVar9->RootWindow)) {
              pIVar14 = pIVar18;
              if (pIVar22 != (ImGuiWindow *)0x0) break;
              pIVar22 = (ImGuiWindow *)0x0;
            }
            else {
              pIVar14 = (ImGuiWindow *)0x0;
            }
          }
        }
      }
      uVar13 = uVar13 - 1;
    } while (1 < uVar13);
  }
  pIVar8->HoveredWindow = pIVar22;
  pIVar8->HoveredWindowUnderMovingWindow = pIVar14;
  pIVar9 = GetTopMostPopupModal();
  bVar23 = false;
  if ((pIVar9 != (ImGuiWindow *)0x0) && (bVar23 = false, pIVar22 != (ImGuiWindow *)0x0)) {
    pIVar14 = pIVar22->RootWindow;
    if (pIVar14->RootWindow == pIVar9) {
      bVar23 = false;
    }
    else {
      do {
        bVar23 = pIVar14 != pIVar9;
        if (pIVar14 == pIVar9) break;
        pIVar14 = pIVar14->ParentWindow;
      } while (pIVar14 != (ImGuiWindow *)0x0);
    }
  }
  uVar11 = (pIVar8->IO).ConfigFlags;
  iVar17 = -1;
  lVar12 = 0;
  bVar15 = 0;
  do {
    if ((pIVar8->IO).MouseClicked[lVar12] == true) {
      bVar19 = true;
      if (pIVar22 == (ImGuiWindow *)0x0) {
        bVar19 = 0 < (pIVar8->OpenPopupStack).Size;
      }
      (pIVar8->IO).MouseDownOwned[lVar12] = bVar19;
    }
    bVar19 = (pIVar8->IO).MouseDown[lVar12];
    if ((bVar19 == true) &&
       ((iVar17 == -1 ||
        (dVar5 = (pIVar8->IO).MouseClickedTime[iVar17],
        pdVar1 = (pIVar8->IO).MouseClickedTime + lVar12, *pdVar1 <= dVar5 && dVar5 != *pdVar1)))) {
      iVar17 = (int)lVar12;
    }
    bVar15 = bVar15 & 1 | bVar19;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 5);
  bVar21 = 1;
  bVar16 = 1;
  if (iVar17 != -1) {
    bVar16 = (pIVar8->IO).MouseDownOwned[iVar17];
  }
  bVar20 = (byte)((uVar11 & 0x10) >> 4) | bVar23;
  if (pIVar8->DragDropActive == true) {
    bVar21 = (pIVar8->DragDropSourceFlags & 0x10U) == 0 | bVar20;
  }
  if (bVar16 != 0) {
    bVar21 = bVar20;
  }
  if (bVar21 != 0) {
    pIVar8->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar8->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    pIVar22 = (ImGuiWindow *)0x0;
  }
  if (pIVar8->WantCaptureMouseNextFrame == -1) {
    bVar23 = true;
    if ((bVar16 & (pIVar22 != (ImGuiWindow *)0x0 || bVar15 != 0)) == 0) {
      bVar23 = 0 < (pIVar8->OpenPopupStack).Size;
    }
    (pIVar8->IO).WantCaptureMouse = bVar23;
  }
  else {
    (pIVar8->IO).WantCaptureMouse = pIVar8->WantCaptureMouseNextFrame != 0;
  }
  if (pIVar8->WantCaptureKeyboardNextFrame == -1) {
    bVar23 = pIVar8->ActiveId != 0 || pIVar9 != (ImGuiWindow *)0x0;
  }
  else {
    bVar23 = pIVar8->WantCaptureKeyboardNextFrame != 0;
  }
  uVar11 = uVar11 & 9;
  uVar10 = (char)uVar11;
  if (uVar11 != 1) {
    uVar10 = bVar23;
  }
  if ((pIVar8->IO).NavActive == false) {
    uVar10 = bVar23;
  }
  (pIVar8->IO).WantCaptureKeyboard = (bool)uVar10;
  (pIVar8->IO).WantTextInput = pIVar8->WantTextInputNextFrame - 1U < 0xfffffffe;
  return;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;
    g.WindowsHoverPadding = ImMax(g.Style.TouchExtraPadding, ImVec2(WINDOWS_HOVER_PADDING, WINDOWS_HOVER_PADDING));

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredWindow && !IsWindowChildOf(g.HoveredWindow->RootWindow, modal_window))
        clear_hovered_windows = true;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (g.OpenPopupStack.Size > 0);
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to Dear ImGui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (g.OpenPopupStack.Size > 0);

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to Dear ImGui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}